

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckImage(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Bool BVar9;
  uint uVar10;
  int iVar11;
  ctmbstr ptVar12;
  ctmbstr word_1;
  ctmbstr word;
  AttVal *pAStack_40;
  int width;
  AttVal *av;
  Bool HasTriggeredMissingLongDesc;
  Bool HasValidWidthHR;
  Bool HasValidWidthBullet;
  Bool HasValidHeight;
  Bool HasDLINK;
  Bool HasLongDesc;
  Bool HasIsMap;
  Bool HasAlt;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  bVar8 = false;
  bVar5 = false;
  bVar7 = false;
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  bVar6 = false;
  BVar9 = Level1_Enabled(doc);
  if (BVar9 != no) {
    for (pAStack_40 = node->attributes; pAStack_40 != (AttVal *)0x0; pAStack_40 = pAStack_40->next)
    {
      if (((pAStack_40 == (AttVal *)0x0) || (pAStack_40->dict == (Attribute *)0x0)) ||
         (pAStack_40->dict->id != TidyAttr_ALT)) {
        if (((pAStack_40 == (AttVal *)0x0) || (pAStack_40->dict == (Attribute *)0x0)) ||
           (pAStack_40->dict->id != TidyAttr_WIDTH)) {
          if (((pAStack_40 == (AttVal *)0x0) || (pAStack_40->dict == (Attribute *)0x0)) ||
             (pAStack_40->dict->id != TidyAttr_HEIGHT)) {
            if (((pAStack_40 == (AttVal *)0x0) || (pAStack_40->dict == (Attribute *)0x0)) ||
               (pAStack_40->dict->id != TidyAttr_LONGDESC)) {
              if (((pAStack_40 == (AttVal *)0x0) || (pAStack_40->dict == (Attribute *)0x0)) ||
                 (pAStack_40->dict->id != TidyAttr_USEMAP)) {
                if (((pAStack_40 != (AttVal *)0x0) && (pAStack_40->dict != (Attribute *)0x0)) &&
                   (pAStack_40->dict->id == TidyAttr_ISMAP)) {
                  bVar8 = true;
                }
              }
              else {
                BVar9 = hasValue(pAStack_40);
                if (BVar9 != no) {
                  (doc->access).HasUseMap = yes;
                }
              }
            }
            else {
              BVar9 = hasValue(pAStack_40);
              if ((BVar9 != no) && (uVar10 = prvTidytmbstrlen(pAStack_40->value), 1 < uVar10)) {
                bVar5 = true;
              }
            }
          }
          else {
            BVar9 = hasValue(pAStack_40);
            if ((BVar9 != no) && (iVar11 = atoi(pAStack_40->value), iVar11 < 0x1e)) {
              bVar3 = true;
            }
          }
        }
        else {
          BVar9 = hasValue(pAStack_40);
          if (BVar9 != no) {
            iVar11 = atoi(pAStack_40->value);
            if (iVar11 < 0x1e) {
              bVar2 = true;
            }
            if (0x96 < iVar11) {
              bVar4 = true;
            }
          }
        }
      }
      else if (pAStack_40->value != (tmbstr)0x0) {
        uVar10 = prvTidytmbstrlen(pAStack_40->value);
        if ((((uVar10 < 0x96) && (BVar9 = IsPlaceholderAlt(pAStack_40->value), BVar9 == no)) &&
            (BVar9 = IsPlaceHolderObject(pAStack_40->value), BVar9 == no)) &&
           ((BVar9 = EndsWithBytes(pAStack_40->value), BVar9 == no &&
            (BVar9 = IsImage(pAStack_40->value), BVar9 == no)))) {
          bVar1 = true;
        }
        else {
          uVar10 = prvTidytmbstrlen(pAStack_40->value);
          if (uVar10 < 0x97) {
            BVar9 = IsImage(pAStack_40->value);
            if (BVar9 == yes) {
              bVar1 = true;
              prvTidyReportAccessError(doc,node,0x296);
            }
            else {
              BVar9 = IsPlaceholderAlt(pAStack_40->value);
              if (BVar9 == yes) {
                bVar1 = true;
                prvTidyReportAccessError(doc,node,0x298);
              }
              else {
                BVar9 = EndsWithBytes(pAStack_40->value);
                if (BVar9 == yes) {
                  bVar1 = true;
                  prvTidyReportAccessError(doc,node,0x297);
                }
              }
            }
          }
          else {
            bVar1 = true;
            prvTidyReportAccessError(doc,node,0x299);
          }
        }
      }
    }
    _HasIsMap = node;
    if (((node->next != (Node *)0x0) && (node->next->tag != (Dict *)0x0)) &&
       ((node->next->tag->id == TidyTag_A &&
        ((_HasIsMap = node->next, _HasIsMap->content != (Node *)0x0 &&
         (_HasIsMap->content->tag == (Dict *)0x0)))))) {
      ptVar12 = textFromOneNode(doc,_HasIsMap->content);
      iVar11 = prvTidytmbstrcmp(ptVar12,"d");
      if ((iVar11 == 0) || (iVar11 = prvTidytmbstrcmp(ptVar12,"D"), iVar11 == 0)) {
        bVar7 = true;
      }
    }
    if (((((_HasIsMap->next != (Node *)0x0) && (_HasIsMap->next->tag == (Dict *)0x0)) &&
         (_HasIsMap = _HasIsMap->next, _HasIsMap->next != (Node *)0x0)) &&
        ((_HasIsMap->next->tag != (Dict *)0x0 && (_HasIsMap->next->tag->id == TidyTag_A)))) &&
       ((_HasIsMap = _HasIsMap->next, _HasIsMap->content != (Node *)0x0 &&
        (_HasIsMap->content->tag == (Dict *)0x0)))) {
      ptVar12 = textFromOneNode(doc,_HasIsMap->content);
      iVar11 = prvTidytmbstrcmp(ptVar12,"d");
      if ((iVar11 == 0) || (iVar11 = prvTidytmbstrcmp(ptVar12,"D"), iVar11 == 0)) {
        bVar7 = true;
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,_HasIsMap,0x295);
    }
    if (((!bVar5) && (bVar3)) && ((bVar4 || (bVar2)))) {
      bVar6 = true;
    }
    if (!bVar6) {
      if ((bVar7) && (!bVar5)) {
        prvTidyReportAccessError(doc,_HasIsMap,0x29c);
      }
      if ((bVar5) && (!bVar7)) {
        prvTidyReportAccessError(doc,_HasIsMap,0x29b);
      }
      if ((!bVar5) && (!bVar7)) {
        prvTidyReportAccessError(doc,_HasIsMap,0x29a);
      }
    }
    if (bVar8) {
      prvTidyReportAccessError(doc,_HasIsMap,0x2ec);
      prvTidyReportAccessError(doc,_HasIsMap,0x2aa);
    }
  }
  return;
}

Assistant:

static void CheckImage( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasIsMap = no;
    Bool HasLongDesc = no;
    Bool HasDLINK = no;
    Bool HasValidHeight = no;
    Bool HasValidWidthBullet = no;
    Bool HasValidWidthHR = no; 
    Bool HasTriggeredMissingLongDesc = no;

    AttVal* av;
                
    if (Level1_Enabled( doc ))
    {
        /* Checks all image attributes for invalid values within attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* 
               Checks for valid ALT attribute.
               The length of the alt text must be less than 150 characters 
               long.
            */
            if ( attrIsALT(av) )
            {
                if (av->value != NULL) 
                {
                    if ((TY_(tmbstrlen)(av->value) < 150) &&
                        (IsPlaceholderAlt (av->value) == no) &&
                        (IsPlaceHolderObject (av->value) == no) &&
                        (EndsWithBytes (av->value) == no) &&
                        (IsImage (av->value) == no))
                    {
                        HasAlt = yes;
                    }

                    else if (TY_(tmbstrlen)(av->value) > 150)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_TOO_LONG );
                    }

                    else if (IsImage (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILENAME);
                    }
            
                    else if (IsPlaceholderAlt (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_PLACEHOLDER);
                    }

                    else if (EndsWithBytes (av->value) == yes)
                    {
                        HasAlt = yes;
                        TY_(ReportAccessError)( doc, node, IMG_ALT_SUSPICIOUS_FILE_SIZE);
                    }
                }
            }

            /* 
               Checks for width values of 'bullets' and 'horizontal
               rules' for validity.

               Valid pixel width for 'bullets' must be < 30, and > 150 for
               horizontal rules.
            */
            else if ( attrIsWIDTH(av) )
            {
                /* Longdesc attribute needed if width attribute is not present. */
                if ( hasValue(av) )
                {
                    int width = atoi( av->value );
                    if ( width < 30 )
                        HasValidWidthBullet = yes;

                    if ( width > 150 )
                        HasValidWidthHR = yes;
                }
            }

            /* 
               Checks for height values of 'bullets' and horizontal
               rules for validity.

               Valid pixel height for 'bullets' and horizontal rules 
               mustt be < 30.
            */
            else if ( attrIsHEIGHT(av) )
            {
                /* Longdesc attribute needed if height attribute not present. */
                if ( hasValue(av) && atoi(av->value) < 30 )
                    HasValidHeight = yes;
            }

            /* 
               Checks for longdesc and determines validity.  
               The length of the 'longdesc' must be > 1
            */
            else if ( attrIsLONGDESC(av) )
            {
                if ( hasValue(av) && TY_(tmbstrlen)(av->value) > 1 )
                    HasLongDesc = yes;
              }

            /* 
               Checks for 'USEMAP' attribute.  Ensures that
               text links are provided for client-side image maps
            */
            else if ( attrIsUSEMAP(av) )
            {
                if ( hasValue(av) )
                    doc->access.HasUseMap = yes;
            }    

            else if ( attrIsISMAP(av) )
            {
                HasIsMap = yes;
            }
        }    
        
        
        /* 
            Check to see if a dLINK is present.  The ANCHOR element must
            be present following the IMG element.  The text found between 
            the ANCHOR tags must be < 6 characters long, and must contain
            the letter 'd'.
        */
        if ( nodeIsA(node->next) )
        {
            node = node->next;
            
            /* 
                Node following the anchor must be a text node
                for dLINK to exist 
            */

            if (node->content != NULL && (node->content)->tag == NULL)
            {
                /* Number of characters found within the text node */
                ctmbstr word = textFromOneNode( doc, node->content);
                    
                if ((TY_(tmbstrcmp)(word,"d") == 0)||
                    (TY_(tmbstrcmp)(word,"D") == 0))
                {
                    HasDLINK = yes;
                }
            }
        }
                    
        /*
            Special case check for dLINK.  This will occur if there is 
            whitespace between the <img> and <a> elements.  Ignores 
            whitespace and continues check for dLINK.
        */
        
        if ( node->next && !node->next->tag )
        {
            node = node->next;

            if ( nodeIsA(node->next) )
            {
                node = node->next;

                /* 
                    Node following the ANCHOR must be a text node
                    for dLINK to exist 
                */
                if (node->content != NULL && node->content->tag == NULL)
                {
                    /* Number of characters found within the text node */
                    ctmbstr word = textFromOneNode( doc, node->content );

                    if ((TY_(tmbstrcmp)(word, "d") == 0)||
                        (TY_(tmbstrcmp)(word, "D") == 0))
                    {
                        HasDLINK = yes;
                    }
                }
            }
        }

        if ((HasAlt == no)&&
            (HasValidWidthBullet == yes)&&
            (HasValidHeight == yes))
        {
        }

        if ((HasAlt == no)&&
            (HasValidWidthHR == yes)&&
            (HasValidHeight == yes))
        {
        }

        if (HasAlt == no)
        {
            TY_(ReportAccessError)( doc, node, IMG_MISSING_ALT);
        }

        if ((HasLongDesc == no)&&
            (HasValidHeight ==yes)&&
            ((HasValidWidthHR == yes)||
             (HasValidWidthBullet == yes)))
        {
            HasTriggeredMissingLongDesc = yes;
        }

        if (HasTriggeredMissingLongDesc == no)
        {
            if ((HasDLINK == yes)&&
                (HasLongDesc == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC);
            }

            if ((HasLongDesc == yes)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_DLINK);
            }

            if ((HasLongDesc == no)&&
                (HasDLINK == no))
            {
                TY_(ReportAccessError)( doc, node, IMG_MISSING_LONGDESC_DLINK);
            }
        }

        if (HasIsMap == yes)
        {
            TY_(ReportAccessError)( doc, node, IMAGE_MAP_SERVER_SIDE_REQUIRES_CONVERSION);

            TY_(ReportAccessError)( doc, node, IMG_MAP_SERVER_REQUIRES_TEXT_LINKS);
        }
    }
}